

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

void Cof_ManPrintHighFanoutOne(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  uint uVar1;
  Cof_Obj_t *pObj_local;
  
  pObj_local = pObj;
  printf("%7d : ",(ulong)(uint)pObj->Id);
  printf("i/o/c =%2d %5d %5d  ",(ulong)(*(uint *)pObj >> 4 & 0xf),(ulong)(*(uint *)pObj >> 8),
         (ulong)(pObj->nFanoutsM * 2));
  uVar1 = Cof_ObjLevel(p,pObj);
  printf("l =%4d  ",(ulong)uVar1);
  uVar1 = Cof_ManSuppSize(p,&pObj_local,1);
  printf("s =%5d  ",(ulong)uVar1);
  uVar1 = Cof_ManTfiSize(p,&pObj_local,1);
  printf("TFI =%7d  ",(ulong)uVar1);
  uVar1 = Cof_ManTfoSize(p,&pObj_local,1);
  printf("TFO =%7d  ",(ulong)uVar1);
  uVar1 = Cof_ManCountRemoved(p,pObj,0);
  printf("C0 =%6d  ",(ulong)uVar1);
  uVar1 = Cof_ManCountRemoved(p,pObj,1);
  printf("C1 =%6d",(ulong)uVar1);
  putchar(10);
  return;
}

Assistant:

void Cof_ManPrintHighFanoutOne( Cof_Man_t * p, Cof_Obj_t * pObj )
{
    printf( "%7d : ",     pObj->Id );
    printf( "i/o/c =%2d %5d %5d  ",  Cof_ObjFaninNum(pObj), Cof_ObjFanoutNum(pObj), 2*pObj->nFanoutsM );
    printf( "l =%4d  ",   Cof_ObjLevel(p, pObj) );
    printf( "s =%5d  ",   Cof_ManSuppSize(p, &pObj, 1) );
    printf( "TFI =%7d  ", Cof_ManTfiSize(p, &pObj, 1) );
    printf( "TFO =%7d  ", Cof_ManTfoSize(p, &pObj, 1) );
    printf( "C0 =%6d  ",  Cof_ManCountRemoved(p, pObj, 0) );
    printf( "C1 =%6d",    Cof_ManCountRemoved(p, pObj, 1) );
    printf( "\n" );
}